

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChObject.h
# Opt level: O1

shared_ptr<chrono::ChBody> __thiscall
chrono::
ChContainerSearchFromID<std::shared_ptr<chrono::ChBody>,__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChBody>*,std::vector<std::shared_ptr<chrono::ChBody>,std::allocator<std::shared_ptr<chrono::ChBody>>>>>
          (chrono *this,int myID,
          __normal_iterator<std::shared_ptr<chrono::ChBody>_*,_std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>_>
          from,__normal_iterator<std::shared_ptr<chrono::ChBody>_*,_std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>_>
               to)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __normal_iterator<std::shared_ptr<chrono::ChBody>_*,_std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>_>
  iter;
  shared_ptr<chrono::ChBody> sVar3;
  shared_ptr<chrono::ChBody> sVar4;
  shared_ptr<chrono::ChBody> sVar5;
  
  do {
    if (from._M_current == to._M_current) {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
LAB_0054e890:
      sVar3.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)from._M_current;
      sVar3.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<chrono::ChBody>)
             sVar3.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
    }
    peVar1 = ((__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *)
             &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)from._M_current)->
              _vptr__Sp_counted_base)->_M_ptr;
    if ((peVar1->super_ChPhysicsItem).super_ChObj.m_identifier == myID) {
      *(element_type **)this = peVar1;
      p_Var2 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)from._M_current)->_M_use_count)->
               _M_pi;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = p_Var2;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded != '\0') {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          sVar4.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
          sVar4.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)this;
          return (shared_ptr<chrono::ChBody>)
                 sVar4.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
        }
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
        sVar5.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
        sVar5.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (shared_ptr<chrono::ChBody>)
               sVar5.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
      }
      goto LAB_0054e890;
    }
    from._M_current = from._M_current + 1;
  } while( true );
}

Assistant:

T ChContainerSearchFromID(int myID, Iterator from, Iterator to) {
    Iterator iter = from;
    while (iter != to) {
        if (myID == (*iter)->GetIdentifier())
            return (*iter);
        iter++;
    }
    return T(0);
}